

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O1

void __thiscall
r_exec::PrimaryMDLController::abduce_simulated_lhs
          (PrimaryMDLController *this,HLPBindingMap *bm,Fact *super_goal,Fact *f_imdl,bool opposite,
          double confidence,Sim *sim)

{
  atomic_int_fast64_t *paVar1;
  Sim *pSVar2;
  bool bVar3;
  MatchResult MVar4;
  Code *this_00;
  Code *pCVar5;
  Goal *this_01;
  Goal *this_02;
  Code *actor;
  uint64_t after;
  Fact *this_03;
  _GMonitor *m;
  undefined8 uVar6;
  _Fact *evidence;
  _Fact *local_38;
  
  bVar3 = HLPController::evaluate_bwd_guards((HLPController *)this,bm);
  if (!bVar3) {
    return;
  }
  this_00 = HLPBindingMap::bind_pattern
                      (bm,(Code *)(this->super_PMDLController).super_MDLController.lhs.object);
  if (this_00 != (Code *)0x0) {
    LOCK();
    paVar1 = &(this_00->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  if (opposite) {
    _Fact::set_opposite((_Fact *)this_00);
  }
  _Fact::set_cfd((_Fact *)this_00,confidence);
  MVar4 = HLPController::check_evidences((HLPController *)this,(_Fact *)this_00,&local_38);
  uVar6 = 1;
  if (MVar4 != MATCH_SUCCESS_POSITIVE) {
    if (MVar4 != MATCH_SUCCESS_NEGATIVE) {
      if (MVar4 != MATCH_FAILURE) goto LAB_00181b08;
      MVar4 = HLPController::check_predicted_evidences
                        ((HLPController *)this,(_Fact *)this_00,&local_38);
      if (MVar4 == MATCH_SUCCESS_POSITIVE) goto LAB_00181af0;
      if (MVar4 == MATCH_FAILURE) {
        pCVar5 = (Code *)(**(code **)((long)(f_imdl->super__Fact).super_LObject.
                                            super_Object<r_code::LObject,_r_exec::LObject>.
                                            super_LObject.super_Code.super__Object._vptr__Object +
                                     0x48))(f_imdl,0);
        pCVar5 = HLPBindingMap::bind_pattern(bm,pCVar5);
        (**(code **)((long)(f_imdl->super__Fact).super_LObject.
                           super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                           super__Object._vptr__Object + 0x40))(f_imdl,0,pCVar5);
        this_01 = (Goal *)operator_new(0x160);
        this_02 = _Fact::get_goal(&super_goal->super__Fact);
        actor = Goal::get_actor(this_02);
        pCVar5 = this_00;
        Goal::Goal(this_01,(_Fact *)this_00,actor,1.0);
        pSVar2 = (Sim *)(this_01->sim).object;
        if (pSVar2 != sim) {
          if (pSVar2 != (Sim *)0x0) {
            LOCK();
            paVar1 = &(pSVar2->super__Object).refCount;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pSVar2->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
              (*(pSVar2->super__Object)._vptr__Object[1])();
            }
          }
          (this_01->sim).object = &sim->super__Object;
          if (sim != (Sim *)0x0) {
            LOCK();
            paVar1 = &(sim->super__Object).refCount;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
            UNLOCK();
          }
        }
        after = (*Now)();
        this_03 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)pCVar5);
        Fact::Fact(this_03,(Code *)this_01,after,after,1.0,1.0);
        m = (_GMonitor *)operator_new(0xb8);
        SGMonitor::SGMonitor((SGMonitor *)m,this,&bm->super_BindingMap,sim->thz,this_03,f_imdl);
        PMDLController::add_g_monitor(&this->super_PMDLController,m);
        PMDLController::inject_simulation(&this->super_PMDLController,this_03);
        goto LAB_00181b08;
      }
      if (MVar4 != MATCH_SUCCESS_NEGATIVE) goto LAB_00181b08;
    }
    uVar6 = 0;
  }
LAB_00181af0:
  (**(code **)((long)(this->super_PMDLController).super_MDLController.super_HLPController.
                     super_OController.super_Controller.super__Object._vptr__Object + 0x80))
            (this,super_goal,uVar6,local_38);
LAB_00181b08:
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  if ((this_00->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
    (*(this_00->super__Object)._vptr__Object[1])(this_00);
  }
  return;
}

Assistant:

void PrimaryMDLController::abduce_simulated_lhs(HLPBindingMap *bm, Fact *super_goal, Fact *f_imdl, bool opposite, double confidence, Sim *sim)   // goal is f->g->f->object or f->g->|f->object; called concurrently by redcue() and _GMonitor::update().
{
    if (evaluate_bwd_guards(bm)) { // bm may be updated.
        P<_Fact> bound_lhs = (_Fact *)bm->bind_pattern(get_lhs());

        if (opposite) {
            bound_lhs->set_opposite();
        }

        bound_lhs->set_cfd(confidence);
        _Fact *evidence;

        switch (check_evidences(bound_lhs, evidence)) {
        case MATCH_SUCCESS_POSITIVE: // an evidence is already known: stop the simulation.
            register_simulated_goal_outcome(super_goal, true, evidence);
            break;

        case MATCH_SUCCESS_NEGATIVE: // a counter evidence is already known: stop the simulation.
            register_simulated_goal_outcome(super_goal, false, evidence);
            break;

        case MATCH_FAILURE:
            switch (check_predicted_evidences(bound_lhs, evidence)) {
            case MATCH_SUCCESS_POSITIVE: // a predicted evidence is already known: stop the simulation.
                register_simulated_goal_outcome(super_goal, true, evidence);
                break;

            case MATCH_SUCCESS_NEGATIVE:
                register_simulated_goal_outcome(super_goal, false, evidence);
                break;

            case MATCH_FAILURE: {
                f_imdl->set_reference(0, bm->bind_pattern(f_imdl->get_reference(0))); // valuate f_imdl from updated bm.
                Goal *sub_goal = new Goal(bound_lhs, super_goal->get_goal()->get_actor(), 1);
                sub_goal->sim = sim;
                uint64_t now = Now();
                Fact *f_sub_goal = new Fact(sub_goal, now, now, 1, 1);
                add_g_monitor(new SGMonitor(this, bm, sim->thz, f_sub_goal, f_imdl));
                inject_simulation(f_sub_goal);
                break;
            }
            }

            break;
        }
    }
}